

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::GetPropertyWPCache<false,Js::JavascriptString*>
               (Var instance,RecyclableObject *propertyObject,JavascriptString *propertyKey,
               Var *value,ScriptContext *requestContext,PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  
  if (value == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x7ff,"(value)","value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  while (((propertyObject->type).ptr)->typeId != TypeIds_Null) {
    iVar3 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x13])
                      (propertyObject,instance,propertyKey,value,info,requestContext);
    if (iVar3 != 0) {
      bVar2 = VarIsImpl<Js::UnscopablesWrapperObject>(propertyObject);
      if ((!bVar2) && (info->propertyRecordUsageCache != (PropertyRecordUsageCache *)0x0)) {
        CacheOperators::CachePropertyRead
                  (instance,propertyObject,false,
                   ((info->propertyRecordUsageCache->propertyRecord).ptr)->pid,false,info,
                   requestContext);
      }
      return (uint)(iVar3 == 1);
    }
    BVar4 = RecyclableObject::SkipsPrototype(propertyObject);
    if (BVar4 != 0) break;
    propertyObject = GetPrototypeNoTrap(propertyObject);
  }
  if (info->propertyRecordUsageCache != (PropertyRecordUsageCache *)0x0) {
    TryCacheMissingProperty
              (instance,instance,false,((info->propertyRecordUsageCache->propertyRecord).ptr)->pid,
               requestContext,info);
  }
  pRVar6 = ScriptContext::GetMissingPropertyResult(requestContext);
  *value = pRVar6;
  return 0;
}

Assistant:

BOOL JavascriptOperators::GetPropertyWPCache(Var instance, RecyclableObject* propertyObject, PropertyKeyType propertyKey, Var* value, ScriptContext* requestContext, _Inout_ PropertyValueInfo * info)
    {
        Assert(value);
        RecyclableObject* object = propertyObject;
        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result = QueryGetOrHasProperty<OutputExistence>(instance, object, propertyKey, value, info, requestContext);

            if (result != PropertyQueryFlags::Property_NotFound)
            {
                if (!VarIs<UnscopablesWrapperObject>(object) && info->GetPropertyRecordUsageCache())
                {
                    PropertyId propertyId = info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId();
                    CacheOperators::CachePropertyRead(instance, object, false, propertyId, false, info, requestContext);
                }
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result);
            }

            // SkipsPrototype refers only to the Get operation, not Has. Some objects like CustomExternalObject respond
            // to HasPropertyQuery with info only about the object itself and GetPropertyQuery with info about its prototype chain.
            // For consistency with the behavior of JavascriptOperators::HasProperty, don't skip prototypes when outputting existence.
            if (!OutputExistence && object->SkipsPrototype())
            {
                break;
            }
            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }
        if (info->GetPropertyRecordUsageCache())
        {
            TryCacheMissingProperty(instance, instance, false /*isRoot*/, info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), requestContext, info);
        }

        *value = OutputExistence
            ? requestContext->GetLibrary()->GetFalse()
            : requestContext->GetMissingPropertyResult();
        return FALSE;
    }